

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O3

int jpeg_huff_decode(bitread_working_state *state,bit_buf_type get_buffer,int bits_left,
                    d_derived_tbl *htbl,int min_bits)

{
  j_decompress_ptr pjVar1;
  jpeg_error_mgr *pjVar2;
  long lVar3;
  boolean bVar4;
  uint uVar5;
  int bits_left_00;
  long lVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar6;
  
  if (bits_left < min_bits) {
    bVar4 = jpeg_fill_bit_buffer(state,get_buffer,bits_left,min_bits);
    if (bVar4 == 0) {
      return -1;
    }
    get_buffer = state->get_buffer;
    bits_left = state->bits_left;
  }
  uVar5 = bits_left - min_bits;
  uVar6 = (ulong)uVar5;
  uVar9 = (ulong)(int)((uint)(get_buffer >> ((byte)uVar5 & 0x3f)) & bmask[(uint)min_bits]);
  lVar7 = (long)min_bits;
  lVar8 = lVar7;
  if (htbl->maxcode[lVar7] < (long)uVar9) {
    do {
      bits_left_00 = (int)uVar6;
      if (bits_left_00 < 1) {
        bVar4 = jpeg_fill_bit_buffer(state,get_buffer,bits_left_00,1);
        if (bVar4 == 0) {
          return -1;
        }
        get_buffer = state->get_buffer;
        bits_left_00 = state->bits_left;
      }
      uVar5 = bits_left_00 - 1;
      uVar6 = (ulong)uVar5;
      uVar9 = (ulong)(((ulong)get_buffer >> (uVar6 & 0x3f) & 1) != 0) | uVar9 * 2;
      lVar7 = lVar8 + 1;
      lVar3 = lVar8 + 1;
      lVar8 = lVar7;
    } while (htbl->maxcode[lVar3] < (long)uVar9);
    min_bits = (int)lVar7;
  }
  state->get_buffer = get_buffer;
  state->bits_left = uVar5;
  if (min_bits < 0x11) {
    uVar5 = (uint)htbl->pub->huffval[(int)uVar9 + (int)htbl->valoffset[lVar7]];
  }
  else {
    pjVar1 = state->cinfo;
    pjVar2 = pjVar1->err;
    pjVar2->msg_code = 0x79;
    (*pjVar2->emit_message)((j_common_ptr)pjVar1,-1);
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

LOCAL(int)
jpeg_huff_decode (bitread_working_state * state,
		  register bit_buf_type get_buffer, register int bits_left,
		  d_derived_tbl * htbl, int min_bits)
{
  register int l = min_bits;
  register INT32 code;

  /* HUFF_DECODE has determined that the code is at least min_bits */
  /* bits long, so fetch that many bits in one swoop. */

  CHECK_BIT_BUFFER(*state, l, return -1);
  code = GET_BITS(l);

  /* Collect the rest of the Huffman code one bit at a time. */
  /* This is per Figure F.16 in the JPEG spec. */

  while (code > htbl->maxcode[l]) {
    code <<= 1;
    CHECK_BIT_BUFFER(*state, 1, return -1);
    code |= GET_BITS(1);
    l++;
  }

  /* Unload the local registers */
  state->get_buffer = get_buffer;
  state->bits_left = bits_left;

  /* With garbage input we may reach the sentinel value l = 17. */

  if (l > 16) {
    WARNMS(state->cinfo, JWRN_HUFF_BAD_CODE);
    return 0;			/* fake a zero as the safest result */
  }

  return htbl->pub->huffval[ (int) (code + htbl->valoffset[l]) ];
}